

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineBlocker.cpp
# Opt level: O1

void __thiscall
tiger::trains::ai::LineBlocker::changeCurrentBlock
          (LineBlocker *this,
          vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
          *points)

{
  pointer *pppVar1;
  pointer ppVar2;
  _Rb_tree<std::pair<int,_tiger::trains::ai::LineBlock>,_std::pair<int,_tiger::trains::ai::LineBlock>,_std::_Identity<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
  *this_00;
  pointer ppLVar3;
  Line *this_01;
  iterator iVar4;
  bool bVar5;
  int iVar6;
  Player *this_02;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *pvVar7;
  Point *pPVar8;
  Point *pPVar9;
  pointer ppLVar10;
  pointer ppVar11;
  pair<std::_Rb_tree_iterator<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::_Rb_tree_iterator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
  pVar12;
  pair<int,_tiger::trains::ai::LineBlock> block;
  key_type local_48;
  
  ppVar2 = (this->currentBlock).
           super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar11 = (this->currentBlock).
                 super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar2; ppVar11 = ppVar11 + 1
      ) {
    local_48.second.inPoint = (ppVar11->second).inPoint;
    local_48.first = ppVar11->first;
    local_48._4_4_ = *(undefined4 *)&ppVar11->field_0x4;
    local_48.second.line = (ppVar11->second).line;
    this_00 = &this->blockLines->_M_t;
    pVar12 = std::
             _Rb_tree<std::pair<int,_tiger::trains::ai::LineBlock>,_std::pair<int,_tiger::trains::ai::LineBlock>,_std::_Identity<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
             ::equal_range(this_00,&local_48);
    std::
    _Rb_tree<std::pair<int,_tiger::trains::ai::LineBlock>,_std::pair<int,_tiger::trains::ai::LineBlock>,_std::_Identity<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
    ::_M_erase_aux(this_00,(_Base_ptr)pVar12.first._M_node,(_Base_ptr)pVar12.second._M_node);
  }
  ppVar11 = (this->currentBlock).
            super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->currentBlock).
      super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar11) {
    (this->currentBlock).
    super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar11;
  }
  this_02 = world::Train::getPlayer(this->train);
  world::Player::getHome(this_02);
  pvVar7 = world::Point::getEdges
                     ((points->
                      super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                      )._M_impl.super__Vector_impl_data._M_start[1]);
  ppLVar10 = (pvVar7->
             super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppLVar3 = (pvVar7->
            super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar10 != ppLVar3) {
    do {
      this_01 = *ppLVar10;
      pPVar8 = world::Line::getAnotherPoint
                         (this_01,(points->
                                  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start[1]);
      pPVar9 = *(points->
                super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((pPVar8 == pPVar9) &&
         (bVar5 = BotSharedData::doMove(this->sharedData,pPVar9,this_01), bVar5)) {
        iVar6 = world::Train::getIdx(this->train);
        local_48.second.inPoint =
             (points->
             super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
             )._M_impl.super__Vector_impl_data._M_start[1];
        local_48.first = iVar6;
        iVar4._M_current =
             (this->currentBlock).
             super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->currentBlock).
            super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_48.second.line = this_01;
          std::
          vector<std::pair<int,tiger::trains::ai::LineBlock>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
          ::_M_realloc_insert<std::pair<int,tiger::trains::ai::LineBlock>>
                    ((vector<std::pair<int,tiger::trains::ai::LineBlock>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
                      *)&this->currentBlock,iVar4,&local_48);
        }
        else {
          ((iVar4._M_current)->second).inPoint = local_48.second.inPoint;
          (iVar4._M_current)->first = iVar6;
          *(undefined4 *)&(iVar4._M_current)->field_0x4 = local_48._4_4_;
          ((iVar4._M_current)->second).line = this_01;
          pppVar1 = &(this->currentBlock).
                     super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pppVar1 = *pppVar1 + 1;
          local_48.second.line = this_01;
        }
        std::
        _Rb_tree<std::pair<int,tiger::trains::ai::LineBlock>,std::pair<int,tiger::trains::ai::LineBlock>,std::_Identity<std::pair<int,tiger::trains::ai::LineBlock>>,std::less<std::pair<int,tiger::trains::ai::LineBlock>>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
        ::_M_insert_unique<std::pair<int,tiger::trains::ai::LineBlock>const&>
                  ((_Rb_tree<std::pair<int,tiger::trains::ai::LineBlock>,std::pair<int,tiger::trains::ai::LineBlock>,std::_Identity<std::pair<int,tiger::trains::ai::LineBlock>>,std::less<std::pair<int,tiger::trains::ai::LineBlock>>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
                    *)this->blockLines,
                   (this->currentBlock).
                   super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
      }
      pPVar9 = world::Line::getAnotherPoint
                         (this_01,(points->
                                  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start[1]);
      if (pPVar9 == (points->
                    super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[2]) {
        iVar6 = world::Train::getIdx(this->train);
        local_48.second.inPoint =
             *(points->
              super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
        local_48.first = iVar6;
        iVar4._M_current =
             (this->currentBlock).
             super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->currentBlock).
            super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_48.second.line = this_01;
          std::
          vector<std::pair<int,tiger::trains::ai::LineBlock>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
          ::_M_realloc_insert<std::pair<int,tiger::trains::ai::LineBlock>>
                    ((vector<std::pair<int,tiger::trains::ai::LineBlock>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
                      *)&this->currentBlock,iVar4,&local_48);
        }
        else {
          ((iVar4._M_current)->second).inPoint = local_48.second.inPoint;
          (iVar4._M_current)->first = iVar6;
          *(undefined4 *)&(iVar4._M_current)->field_0x4 = local_48._4_4_;
          ((iVar4._M_current)->second).line = this_01;
          pppVar1 = &(this->currentBlock).
                     super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pppVar1 = *pppVar1 + 1;
          local_48.second.line = this_01;
        }
        std::
        _Rb_tree<std::pair<int,tiger::trains::ai::LineBlock>,std::pair<int,tiger::trains::ai::LineBlock>,std::_Identity<std::pair<int,tiger::trains::ai::LineBlock>>,std::less<std::pair<int,tiger::trains::ai::LineBlock>>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
        ::_M_insert_unique<std::pair<int,tiger::trains::ai::LineBlock>const&>
                  ((_Rb_tree<std::pair<int,tiger::trains::ai::LineBlock>,std::pair<int,tiger::trains::ai::LineBlock>,std::_Identity<std::pair<int,tiger::trains::ai::LineBlock>>,std::less<std::pair<int,tiger::trains::ai::LineBlock>>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
                    *)this->blockLines,
                   (this->currentBlock).
                   super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
      }
      ppLVar10 = ppLVar10 + 1;
    } while (ppLVar10 != ppLVar3);
  }
  return;
}

Assistant:

void LineBlocker::changeCurrentBlock(const std::vector<const world::Point *> &points)
{
    for (auto block : currentBlock)
    {
        blockLines->erase(block);
    }

    currentBlock.clear();

    const world::Town *homeTown = (world::Town *)train->getPlayer()->getHome();


    for (auto line : points[1]->getEdges())
    {

        if (line->getAnotherPoint(points[1]) == points[0])
        {
            if (sharedData->doMove(points[0], line))
            {
                currentBlock.push_back({train->getIdx(), {line, points[1]} });
                blockLines->insert(currentBlock.back());
            }
        }

        if (line->getAnotherPoint(points[1]) == points[2])
        {
            currentBlock.push_back({train->getIdx(), {line, points[0]} });
            blockLines->insert(currentBlock.back());
        }

        /* if (line->getAnotherPoint(points[1]) != points[2] &&
                 line->getAnotherPoint(points[1]) != points[0] &&
                 points[1] != homeTown->getPoint())
         {
             currentBlock.push_back({train->getIdx(), {line, line->getAnotherPoint(points[1])} });
             blockLines->insert(currentBlock.back());
         }*/

    }


}